

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O0

void __thiscall
sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::BasicSignal
          (BasicSignal<void_(),_std::lock_guard<std::mutex>_> *this,
          BasicSignal<void_(),_std::lock_guard<std::mutex>_> *rhs)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock2;
  lock_guard<std::mutex> lock1;
  vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  *in_stack_00000078;
  vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  *in_stack_00000080;
  undefined1 __i;
  undefined4 in_stack_ffffffffffffffe0;
  memory_order in_stack_ffffffffffffffe4;
  atomic<bool> *in_stack_ffffffffffffffe8;
  
  memset(in_RDI,0,0x50);
  BasicSignal((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)
              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_RDI);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_RDI);
  __i = (undefined1)((ulong)in_RDI >> 0x38);
  std::
  vector<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::Entry>_>
  ::operator=(in_stack_00000080,in_stack_00000078);
  std::atomic<bool>::load(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(bool)__i
            );
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1385c7);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1385d1);
  return;
}

Assistant:

BasicSignal(const BasicSignal &rhs) noexcept : BasicSignal()
  {
    Lock lock1(entriesMutex);
    Lock lock2(rhs.entriesMutex);
    entries = rhs.entries;

    // `atomic_bool` can't be copied, so copy value.
    blocked_ = rhs.blocked_.load();
  }